

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_post.c
# Opt level: O0

int test_post(void)

{
  int iVar1;
  int iVar2;
  int ret;
  
  iVar1 = test_post_number(1);
  iVar2 = test_post_number(2);
  return iVar2 + iVar1;
}

Assistant:

int test_post(void) {
	int ret = 0;

	ret += test_post_number(1); // plain response
    
#if !defined(NHR_NO_POST_DATA)
    ret += test_post_number(2);
#endif
    
	return ret;
}